

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O3

bool __thiscall
sfm::Triangulate::triangulate
          (Triangulate *this,
          vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *poses,
          vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *positions,
          Vec3d *track_pos,Statistics *stats,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *outliers)

{
  ulong uVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  pointer ppCVar8;
  invalid_argument *this_00;
  Matrix<double,_3,_3> *pMVar9;
  double *pdVar10;
  CameraPose *pCVar11;
  pointer ppCVar12;
  ulong uVar13;
  CameraPose **__args;
  Vector<float,_2> *pVVar14;
  ulong uVar15;
  bool bVar16;
  size_type __n;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  undefined8 uStack_148;
  Vec3d ray0;
  Vec3f best_pos;
  Vec3d tmp_pos;
  Matrix<double,_3,_3> ret;
  undefined1 auStack_b8 [8];
  vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> pose_pair;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_outliers;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> position_pair;
  pointer ppCStack_68;
  Vec3d camera_pos;
  pointer ppCStack_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp_outliers;
  
  lVar7 = (long)(poses->
                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(poses->
                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
  __n = lVar7 >> 3;
  if (__n < 2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"At least two poses required");
LAB_00113427:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (lVar7 != (long)(positions->
                     super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(positions->
                     super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Poses and positions size mismatch");
    goto LAB_00113427;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &pose_pair.
              super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__n,
             (allocator_type *)(tmp_pos.v + 2));
  best_pos.v[0] = 0.0;
  ray0.v[2] = 0.0;
  ppCVar8 = (poses->
            super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar12 = (poses->
             super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar12 != ppCVar8) {
    uVar15 = 0;
    do {
      uVar1 = uVar15 + 1;
      uVar13 = (long)ppCVar12 - (long)ppCVar8 >> 3;
      uVar19 = uVar1;
      if (uVar1 < uVar13) {
        do {
          auStack_b8 = (undefined1  [8])0x0;
          pose_pair.
          super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pose_pair.
          super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          position_pair.
          super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          position_pair.
          super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>>::
          _M_realloc_insert<sfm::CameraPose_const*const&>
                    ((vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>> *)
                     auStack_b8,(iterator)0x0,ppCVar8 + uVar15);
          __args = (poses->
                   super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar19;
          if (pose_pair.
              super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              pose_pair.
              super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>>::
            _M_realloc_insert<sfm::CameraPose_const*const&>
                      ((vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>> *)
                       auStack_b8,
                       (iterator)
                       pose_pair.
                       super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,__args);
          }
          else {
            *pose_pair.
             super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
             _M_impl.super__Vector_impl_data._M_start = *__args;
            pose_pair.
            super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 pose_pair.
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          pVVar14 = (positions->
                    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar15;
          if (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>>::
            _M_realloc_insert<math::Vector<float,2>const&>
                      ((vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>> *)
                       &best_outliers.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (iterator)
                       position_pair.
                       super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,pVVar14);
          }
          else {
            *(undefined8 *)
             (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->v = *(undefined8 *)pVVar14->v;
            position_pair.
            super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 position_pair.
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          pVVar14 = (positions->
                    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar19;
          if (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>>::
            _M_realloc_insert<math::Vector<float,2>const&>
                      ((vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>> *)
                       &best_outliers.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (iterator)
                       position_pair.
                       super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,pVVar14);
          }
          else {
            *(undefined8 *)
             (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->v = *(undefined8 *)pVVar14->v;
            position_pair.
            super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 position_pair.
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          triangulate_track((Vector<double,_3> *)(best_pos.v + 2),
                            (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                             *)&best_outliers.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                             *)auStack_b8);
          if (((!NAN((double)stack0xfffffffffffffee0 - (double)stack0xfffffffffffffee0) &&
                !NAN((double)stack0xfffffffffffffee0)) &&
              (!NAN(tmp_pos.v[0] - tmp_pos.v[0]) && !NAN(tmp_pos.v[0]))) &&
             (!NAN(tmp_pos.v[1] - tmp_pos.v[1]) && !NAN(tmp_pos.v[1]))) {
            if (0.0 < *(double *)(this + 8)) {
              pCVar11 = *(CameraPose **)auStack_b8;
              pMVar9 = &pCVar11->R;
              pdVar10 = tmp_pos.v + 2;
              lVar7 = 0;
              do {
                lVar18 = 0;
                pdVar17 = pdVar10;
                do {
                  *pdVar17 = pMVar9->m[lVar18];
                  lVar18 = lVar18 + 1;
                  pdVar17 = pdVar17 + 3;
                } while (lVar18 != 3);
                lVar7 = lVar7 + 1;
                pdVar10 = pdVar10 + 1;
                pMVar9 = (Matrix<double,_3,_3> *)(pMVar9->m + 3);
              } while (lVar7 != 3);
              pdVar10 = tmp_pos.v + 2;
              lVar7 = 0;
              do {
                ppCVar8 = (pointer)0x0;
                lVar18 = 0;
                do {
                  ppCVar8 = (pointer)((double)ppCVar8 +
                                     *(double *)((long)pdVar10 + lVar18) *
                                     *(double *)((long)(pCVar11->t).v + lVar18));
                  lVar18 = lVar18 + 8;
                } while (lVar18 != 0x18);
                (&ppCStack_48)[lVar7] = ppCVar8;
                lVar7 = lVar7 + 1;
                pdVar10 = pdVar10 + 3;
              } while (lVar7 != 3);
              lVar7 = 0;
              do {
                *(ulong *)((long)&ppCStack_48 + lVar7) =
                     *(ulong *)((long)&ppCStack_48 + lVar7) ^ 0x8000000000000000;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              camera_pos.v[1] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
              ppCStack_68 = ppCStack_48;
              camera_pos.v[0] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)tmp_pos.v[1];
              ppCStack_48 = stack0xfffffffffffffee0;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)tmp_pos.v[0];
              lVar7 = 0;
              do {
                *(double *)((long)&ppCStack_48 + lVar7) =
                     *(double *)((long)&ppCStack_48 + lVar7) -
                     *(double *)((long)camera_pos.v + lVar7 + -8);
                puVar6 = tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                puVar5 = tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              tmp_pos.v[2] = (double)ppCStack_48;
              dVar4 = 0.0;
              lVar7 = 0;
              do {
                dVar3 = *(double *)((long)tmp_pos.v + lVar7 + 0x10);
                dVar4 = dVar4 + dVar3 * dVar3;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              lVar7 = 0;
              do {
                *(double *)((long)tmp_pos.v + lVar7 + 0x10) =
                     *(double *)((long)tmp_pos.v + lVar7 + 0x10) / dVar4;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              ray0.v[1] = (double)puVar6;
              uStack_148 = tmp_pos.v[2];
              ray0.v[0] = (double)puVar5;
              pCVar11 = *(pointer)((long)auStack_b8 + 8);
              pMVar9 = &pCVar11->R;
              pdVar10 = tmp_pos.v + 2;
              lVar7 = 0;
              do {
                lVar18 = 0;
                pdVar17 = pdVar10;
                do {
                  *pdVar17 = pMVar9->m[lVar18];
                  lVar18 = lVar18 + 1;
                  pdVar17 = pdVar17 + 3;
                } while (lVar18 != 3);
                lVar7 = lVar7 + 1;
                pdVar10 = pdVar10 + 1;
                pMVar9 = (Matrix<double,_3,_3> *)(pMVar9->m + 3);
              } while (lVar7 != 3);
              pdVar10 = tmp_pos.v + 2;
              lVar7 = 0;
              do {
                ppCVar8 = (pointer)0x0;
                lVar18 = 0;
                do {
                  ppCVar8 = (pointer)((double)ppCVar8 +
                                     *(double *)((long)pdVar10 + lVar18) *
                                     *(double *)((long)(pCVar11->t).v + lVar18));
                  lVar18 = lVar18 + 8;
                } while (lVar18 != 0x18);
                (&ppCStack_48)[lVar7] = ppCVar8;
                lVar7 = lVar7 + 1;
                pdVar10 = pdVar10 + 3;
              } while (lVar7 != 3);
              lVar7 = 0;
              do {
                *(ulong *)((long)&ppCStack_48 + lVar7) =
                     *(ulong *)((long)&ppCStack_48 + lVar7) ^ 0x8000000000000000;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              camera_pos.v[1] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
              ppCStack_68 = ppCStack_48;
              camera_pos.v[0] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)tmp_pos.v[1];
              ppCStack_48 = stack0xfffffffffffffee0;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)tmp_pos.v[0];
              lVar7 = 0;
              do {
                *(double *)((long)&ppCStack_48 + lVar7) =
                     *(double *)((long)&ppCStack_48 + lVar7) -
                     *(double *)((long)camera_pos.v + lVar7 + -8);
                puVar6 = tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                puVar5 = tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              tmp_pos.v[2] = (double)ppCStack_48;
              dVar4 = 0.0;
              lVar7 = 0;
              do {
                dVar3 = *(double *)((long)tmp_pos.v + lVar7 + 0x10);
                dVar4 = dVar4 + dVar3 * dVar3;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              lVar7 = 0;
              do {
                *(double *)((long)tmp_pos.v + lVar7 + 0x10) =
                     *(double *)((long)tmp_pos.v + lVar7 + 0x10) / dVar4;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = puVar6;
              ppCStack_48 = (pointer)tmp_pos.v[2];
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = puVar5;
              dVar4 = 0.0;
              lVar7 = 0;
              do {
                dVar4 = dVar4 + *(double *)((long)ray0.v + lVar7 + -8) *
                                *(double *)((long)&ppCStack_48 + lVar7);
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x18);
              if (*(double *)(this + 0x18) <= dVar4 && dVar4 != *(double *)(this + 0x18))
              goto LAB_00113273;
            }
            ppCStack_48 = (pointer)0x0;
            tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            position_pair.
            super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ppCVar8 = (poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((poses->
                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                )._M_impl.super__Vector_impl_data._M_finish != ppCVar8) {
              do {
                pCVar11 = ppCVar8[(long)position_pair.
                                        super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage];
                pMVar9 = &pCVar11->R;
                lVar7 = 0;
                do {
                  dVar4 = 0.0;
                  lVar18 = 0;
                  do {
                    dVar4 = dVar4 + *(double *)((long)pMVar9->m + lVar18) *
                                    *(double *)((long)best_pos.v + lVar18 + 8);
                    lVar18 = lVar18 + 8;
                  } while (lVar18 != 0x18);
                  ray0.v[lVar7 + -1] = dVar4;
                  lVar7 = lVar7 + 1;
                  pMVar9 = (Matrix<double,_3,_3> *)(pMVar9->m + 3);
                } while (lVar7 != 3);
                tmp_pos.v[2] = uStack_148;
                lVar7 = 0;
                do {
                  *(double *)((long)tmp_pos.v + lVar7 + 0x10) =
                       *(double *)((long)tmp_pos.v + lVar7 + 0x10) +
                       *(double *)((long)(pCVar11->t).v + lVar7);
                  lVar7 = lVar7 + 8;
                } while (lVar7 != 0x18);
                camera_pos.v[1] = ray0.v[1];
                ppCStack_68 = (pointer)tmp_pos.v[2];
                camera_pos.v[0] = ray0.v[0];
                if (ray0.v[1] <= 0.0) {
                  if (tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&ppCStack_48,
                               (iterator)
                               tmp_outliers.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)
                               &position_pair.
                                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
LAB_001131a8:
                    *tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start =
                         (unsigned_long)
                         position_pair.
                         super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         tmp_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
                  }
                }
                else {
                  lVar7 = 0;
                  do {
                    dVar4 = 0.0;
                    lVar18 = 0;
                    do {
                      dVar4 = dVar4 + *(double *)((long)(pCVar11->K).m + lVar18) *
                                      *(double *)((long)camera_pos.v + lVar18 + -8);
                      lVar18 = lVar18 + 8;
                    } while (lVar18 != 0x18);
                    tmp_pos.v[lVar7 + 2] = dVar4;
                    lVar7 = lVar7 + 1;
                    pCVar11 = (CameraPose *)((pCVar11->K).m + 3);
                  } while (lVar7 != 3);
                  ppCStack_68 = (pointer)tmp_pos.v[2];
                  uStack_148 = (double)CONCAT44((float)(ray0.v[0] / ray0.v[1]),
                                                (float)(tmp_pos.v[2] / ray0.v[1]));
                  tmp_pos.v[2] = *(double *)
                                  (positions->
                                  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start
                                  [(long)position_pair.
                                         super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage].v;
                  lVar7 = 0;
                  do {
                    *(float *)((long)tmp_pos.v + lVar7 + 0x10) =
                         *(float *)((long)tmp_pos.v + lVar7 + 0x10) -
                         *(float *)((long)ray0.v + lVar7 + -8);
                    lVar7 = lVar7 + 4;
                  } while (lVar7 != 8);
                  dVar4 = (double)SQRT(tmp_pos.v[2]._4_4_ * tmp_pos.v[2]._4_4_ +
                                       tmp_pos.v[2]._0_4_ * tmp_pos.v[2]._0_4_ + 0.0);
                  if (*(double *)this <= dVar4 && dVar4 != *(double *)this) {
                    if (tmp_outliers.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start !=
                        tmp_outliers.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_001131a8;
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&ppCStack_48,
                               (iterator)
                               tmp_outliers.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)
                               &position_pair.
                                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                }
                position_pair.
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((long)(position_pair.
                                      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->v + 1);
                ppCVar8 = (poses->
                          super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              } while (position_pair.
                       super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage <
                       (pointer)((long)(poses->
                                       super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8
                                >> 3));
            }
            puVar5 = best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppCVar8 = pose_pair.
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((ulong)((long)tmp_outliers.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)ppCStack_48) <
                (ulong)((long)best_outliers.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       (long)pose_pair.
                             super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
              uVar13 = 4;
              lVar7 = 0;
              do {
                *(float *)((long)ray0.v + lVar7 + 0x10) =
                     (float)*(double *)((long)best_pos.v + lVar7 * 2 + 8);
                puVar6 = best_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                uVar13 = uVar13 - 1;
                lVar7 = lVar7 + 4;
              } while (1 < uVar13);
              pose_pair.
              super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppCStack_48;
              best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              ppCStack_48 = ppCVar8;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = puVar5;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = puVar6;
            }
            if (ppCStack_48 != (pointer)0x0) {
              operator_delete(ppCStack_48);
            }
          }
LAB_00113273:
          if (best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(best_outliers.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (auStack_b8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_b8);
          }
          uVar19 = uVar19 + 1;
          ppCVar8 = (poses->
                    super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ppCVar12 = (poses->
                     super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          uVar13 = (long)ppCVar12 - (long)ppCVar8 >> 3;
        } while (uVar19 < uVar13);
      }
      uVar15 = uVar1;
    } while (uVar1 < uVar13);
  }
  fVar20 = 0.0;
  lVar7 = 0;
  do {
    fVar2 = *(float *)((long)ray0.v + lVar7 + 0x10);
    fVar20 = fVar20 + fVar2 * fVar2;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  if (fVar20 < 0.0) {
    fVar20 = sqrtf(fVar20);
  }
  else {
    fVar20 = SQRT(fVar20);
  }
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    if ((ulong)((long)*(int *)(this + 0x10) +
               ((long)best_outliers.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)pose_pair.
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3)) <=
        (ulong)((long)(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3)) {
      uVar15 = 4;
      lVar7 = 0;
      do {
        *(double *)((long)track_pos->v + lVar7 * 2) =
             (double)*(float *)((long)ray0.v + lVar7 + 0x10);
        uVar15 = uVar15 - 1;
        lVar7 = lVar7 + 4;
      } while (1 < uVar15);
      if (stats != (Statistics *)0x0) {
        *(int *)stats = *(int *)stats + 1;
      }
      if (outliers == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        bVar16 = true;
      }
      else {
        ppCVar8 = (pointer)(outliers->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
        puVar5 = (outliers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar6 = (outliers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (outliers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)pose_pair.
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (outliers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
        (outliers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
        bVar16 = true;
        pose_pair.
        super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar8;
        best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar5;
        best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar6;
      }
      goto LAB_0011335b;
    }
    lVar7 = 4;
  }
  else {
    lVar7 = 0xc;
  }
  if (stats != (Statistics *)0x0) {
    *(int *)(stats + lVar7) = *(int *)(stats + lVar7) + 1;
  }
  bVar16 = false;
LAB_0011335b:
  if (pose_pair.
      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(pose_pair.
                    super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return bVar16;
}

Assistant:

bool
Triangulate::triangulate (std::vector<CameraPose const*> const& poses,
    std::vector<math::Vec2f> const& positions,
    math::Vec3d* track_pos, Statistics* stats,
    std::vector<std::size_t>* outliers) const
{
    if (poses.size() < 2)
        throw std::invalid_argument("At least two poses required");
    if (poses.size() != positions.size())
        throw std::invalid_argument("Poses and positions size mismatch");

    /* Check all possible pose pairs for successful triangulation */
    std::vector<std::size_t> best_outliers(positions.size());
    math::Vec3f best_pos(0.0f);
    for (std::size_t p1 = 0; p1 < poses.size(); ++p1)
        for (std::size_t p2 = p1 + 1; p2 < poses.size(); ++p2)
        {
            /* Triangulate position from current pair */
            std::vector<CameraPose const*> pose_pair;
            std::vector<math::Vec2f> position_pair;
            pose_pair.push_back(poses[p1]);
            pose_pair.push_back(poses[p2]);
            position_pair.push_back(positions[p1]);
            position_pair.push_back(positions[p2]);
            math::Vec3d tmp_pos = triangulate_track(position_pair, pose_pair);
            if (MATH_ISNAN(tmp_pos[0]) || MATH_ISINF(tmp_pos[0]) ||
                MATH_ISNAN(tmp_pos[1]) || MATH_ISINF(tmp_pos[1]) ||
                MATH_ISNAN(tmp_pos[2]) || MATH_ISINF(tmp_pos[2]))
                continue;

            /* Check if pair has small triangulation angle. */
            if (this->opts.angle_threshold > 0.0)
            {
                math::Vec3d camera_pos;
                pose_pair[0]->fill_camera_pos(&camera_pos);
                math::Vec3d ray0 = (tmp_pos - camera_pos).normalized();
                pose_pair[1]->fill_camera_pos(&camera_pos);
                math::Vec3d ray1 = (tmp_pos - camera_pos).normalized();
                double const cos_angle = ray0.dot(ray1);
                if (cos_angle > this->cos_angle_thres)
                    continue;
            }

            /* Chek error in all input poses and find outliers. */
            std::vector<std::size_t> tmp_outliers;
            for (std::size_t i = 0; i < poses.size(); ++i)
            {
                math::Vec3d x = poses[i]->R * tmp_pos + poses[i]->t;

                /* Reject track if it appears behind the camera. */
                if (x[2] <= 0.0)
                {
                    tmp_outliers.push_back(i);
                    continue;
                }

                x = poses[i]->K * x;
                math::Vec2d x2d(x[0] / x[2], x[1] / x[2]);
                double error = (positions[i] - x2d).norm();
                if (error > this->opts.error_threshold)
                    tmp_outliers.push_back(i);
            }

            /* Select triangulation with lowest amount of outliers. */
            if (tmp_outliers.size() < best_outliers.size())
            {
                best_pos = tmp_pos;
                std::swap(best_outliers, tmp_outliers);
            }

        }

    /* If all pairs have small angles pos will be 0 here. */
    if (best_pos.norm() == 0.0f)
    {
        if (stats != nullptr)
            stats->num_too_small_angle += 1;
        return false;
    }

    /* Check if required number of inliers is found. */
    if (poses.size() < best_outliers.size() + this->opts.min_num_views)
    {
        if (stats != nullptr)
            stats->num_large_error += 1;
        return false;
    }

    /* Return final position and outliers. */
    *track_pos = best_pos;
    if (stats != nullptr)
        stats->num_new_tracks += 1;
    if (outliers != nullptr)
        std::swap(*outliers, best_outliers);

    return true;
}